

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_writer.cxx
# Opt level: O1

ssize_t __thiscall
xray_re::xr_ini_writer::write(xr_ini_writer *this,int __fd,void *__buf,size_t __n)

{
  long *plVar1;
  ssize_t extraout_RAX;
  long *plVar2;
  undefined4 in_register_00000034;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  long *local_48;
  long local_40;
  long local_38;
  long lStack_30;
  
  if ((int)__n != 0) {
    std::operator+(&local_68,"\"",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__buf);
    plVar1 = (long *)std::__cxx11::string::append((char *)&local_68);
    plVar2 = plVar1 + 2;
    if ((long *)*plVar1 == plVar2) {
      local_38 = *plVar2;
      lStack_30 = plVar1[3];
      local_48 = &local_38;
    }
    else {
      local_38 = *plVar2;
      local_48 = (long *)*plVar1;
    }
    local_40 = plVar1[1];
    *plVar1 = (long)plVar2;
    plVar1[1] = 0;
    *(undefined1 *)(plVar1 + 2) = 0;
    std::__cxx11::string::operator=((string *)__buf,(string *)&local_48);
    if (local_48 != &local_38) {
      operator_delete(local_48,local_38 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
  }
  xr_writer::w_sf((xr_writer *)this,"%9s%-34s = %s\n","",CONCAT44(in_register_00000034,__fd),*__buf)
  ;
  return extraout_RAX;
}

Assistant:

void xr_ini_writer::write(const char *key, std::string value, bool enclose)
{
	if (enclose)
		value = "\"" + value + "\"";
	w_sf("%9s%-34s = %s\n", "",key, value.c_str());
}